

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_keypair_pub
              (secp256k1_context *ctx,secp256k1_pubkey *pubkey,secp256k1_keypair *keypair)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  void *pvVar8;
  char *pcVar9;
  
  if (ctx == (secp256k1_context *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/extrakeys/main_impl.h"
            ,0xe1,"test condition failed: ctx != NULL");
    abort();
  }
  if (pubkey == (secp256k1_pubkey *)0x0) {
    pvVar8 = (ctx->illegal_callback).data;
    pcVar9 = "pubkey != NULL";
  }
  else {
    pubkey->data[0x30] = '\0';
    pubkey->data[0x31] = '\0';
    pubkey->data[0x32] = '\0';
    pubkey->data[0x33] = '\0';
    pubkey->data[0x34] = '\0';
    pubkey->data[0x35] = '\0';
    pubkey->data[0x36] = '\0';
    pubkey->data[0x37] = '\0';
    pubkey->data[0x38] = '\0';
    pubkey->data[0x39] = '\0';
    pubkey->data[0x3a] = '\0';
    pubkey->data[0x3b] = '\0';
    pubkey->data[0x3c] = '\0';
    pubkey->data[0x3d] = '\0';
    pubkey->data[0x3e] = '\0';
    pubkey->data[0x3f] = '\0';
    pubkey->data[0x20] = '\0';
    pubkey->data[0x21] = '\0';
    pubkey->data[0x22] = '\0';
    pubkey->data[0x23] = '\0';
    pubkey->data[0x24] = '\0';
    pubkey->data[0x25] = '\0';
    pubkey->data[0x26] = '\0';
    pubkey->data[0x27] = '\0';
    pubkey->data[0x28] = '\0';
    pubkey->data[0x29] = '\0';
    pubkey->data[0x2a] = '\0';
    pubkey->data[0x2b] = '\0';
    pubkey->data[0x2c] = '\0';
    pubkey->data[0x2d] = '\0';
    pubkey->data[0x2e] = '\0';
    pubkey->data[0x2f] = '\0';
    pubkey->data[0x10] = '\0';
    pubkey->data[0x11] = '\0';
    pubkey->data[0x12] = '\0';
    pubkey->data[0x13] = '\0';
    pubkey->data[0x14] = '\0';
    pubkey->data[0x15] = '\0';
    pubkey->data[0x16] = '\0';
    pubkey->data[0x17] = '\0';
    pubkey->data[0x18] = '\0';
    pubkey->data[0x19] = '\0';
    pubkey->data[0x1a] = '\0';
    pubkey->data[0x1b] = '\0';
    pubkey->data[0x1c] = '\0';
    pubkey->data[0x1d] = '\0';
    pubkey->data[0x1e] = '\0';
    pubkey->data[0x1f] = '\0';
    pubkey->data[0] = '\0';
    pubkey->data[1] = '\0';
    pubkey->data[2] = '\0';
    pubkey->data[3] = '\0';
    pubkey->data[4] = '\0';
    pubkey->data[5] = '\0';
    pubkey->data[6] = '\0';
    pubkey->data[7] = '\0';
    pubkey->data[8] = '\0';
    pubkey->data[9] = '\0';
    pubkey->data[10] = '\0';
    pubkey->data[0xb] = '\0';
    pubkey->data[0xc] = '\0';
    pubkey->data[0xd] = '\0';
    pubkey->data[0xe] = '\0';
    pubkey->data[0xf] = '\0';
    if (keypair != (secp256k1_keypair *)0x0) {
      uVar1 = *(undefined8 *)(keypair->data + 0x20);
      uVar2 = *(undefined8 *)(keypair->data + 0x28);
      uVar3 = *(undefined8 *)(keypair->data + 0x30);
      uVar4 = *(undefined8 *)(keypair->data + 0x38);
      uVar5 = *(undefined8 *)(keypair->data + 0x40);
      uVar6 = *(undefined8 *)(keypair->data + 0x48);
      uVar7 = *(undefined8 *)(keypair->data + 0x58);
      *(undefined8 *)(pubkey->data + 0x30) = *(undefined8 *)(keypair->data + 0x50);
      *(undefined8 *)(pubkey->data + 0x38) = uVar7;
      *(undefined8 *)(pubkey->data + 0x20) = uVar5;
      *(undefined8 *)(pubkey->data + 0x28) = uVar6;
      *(undefined8 *)(pubkey->data + 0x10) = uVar3;
      *(undefined8 *)(pubkey->data + 0x18) = uVar4;
      *(undefined8 *)pubkey->data = uVar1;
      *(undefined8 *)(pubkey->data + 8) = uVar2;
      return 1;
    }
    pvVar8 = (ctx->illegal_callback).data;
    pcVar9 = "keypair != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar9,pvVar8);
  return 0;
}

Assistant:

int secp256k1_keypair_pub(const secp256k1_context* ctx, secp256k1_pubkey *pubkey, const secp256k1_keypair *keypair) {
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);
    memset(pubkey, 0, sizeof(*pubkey));
    ARG_CHECK(keypair != NULL);

    memcpy(pubkey->data, &keypair->data[32], sizeof(*pubkey));
    return 1;
}